

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

Cluster * __thiscall mkvparser::Segment::GetNext(Segment *this,Cluster *pCurr)

{
  Cluster **ppCVar1;
  bool bVar2;
  longlong lVar3;
  longlong lVar4;
  Cluster **ppCVar5;
  Cluster *pCVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  Cluster **ppCVar10;
  long len;
  long len_;
  longlong pos_;
  long local_50;
  long local_48;
  long local_40;
  longlong local_38;
  
  lVar9 = pCurr->m_index;
  if (lVar9 < 0) {
    lVar9 = pCurr->m_element_start;
    lVar8 = this->m_size + this->m_start;
    lVar3 = GetUIntLength(this->m_pReader,lVar9,&local_50);
    if ((lVar3 == 0) && (lVar3 = ReadID(this->m_pReader,lVar9,&local_50), lVar3 == 0x1f43b675)) {
      lVar9 = lVar9 + local_50;
      GetUIntLength(this->m_pReader,lVar9,&local_50);
      lVar3 = ReadUInt(this->m_pReader,lVar9,&local_50);
      lVar9 = lVar3 + lVar9 + local_50;
      if (lVar9 < lVar8) {
        do {
          local_48 = lVar8;
          lVar3 = GetUIntLength(this->m_pReader,lVar9,&local_50);
          if ((lVar3 != 0) || (lVar3 = ReadID(this->m_pReader,lVar9,&local_50), lVar3 < 0))
          goto LAB_001576ad;
          lVar7 = local_50 + lVar9;
          GetUIntLength(this->m_pReader,lVar7,&local_50);
          lVar4 = ReadUInt(this->m_pReader,lVar7,&local_50);
          lVar7 = lVar7 + local_50;
          if (lVar4 != 0) {
            if (lVar3 == 0x1f43b675) {
              lVar9 = lVar9 - this->m_start;
              lVar8 = Cluster::HasBlockEntries(this,lVar9,&local_38,&local_40);
              if (0 < lVar8) goto LAB_001575f4;
            }
            lVar7 = lVar7 + lVar4;
          }
          lVar9 = lVar7;
          lVar8 = local_48;
        } while (lVar7 < local_48);
      }
      lVar9 = 0;
LAB_001575f4:
      if (0 < lVar9) {
        ppCVar10 = this->m_clusters + this->m_clusterCount;
        if (0 < this->m_clusterPreloadCount) {
          ppCVar5 = ppCVar10 + this->m_clusterPreloadCount;
          do {
            ppCVar1 = (Cluster **)
                      ((long)ppCVar10 +
                      (((long)ppCVar5 - (long)ppCVar10 >> 3) -
                       ((long)ppCVar5 - (long)ppCVar10 >> 0x3f) & 0xfffffffffffffffeU) * 4);
            pCVar6 = *ppCVar1;
            lVar8 = pCVar6->m_element_start - pCVar6->m_pSegment->m_start;
            if (lVar8 < lVar9) {
              ppCVar10 = ppCVar1 + 1;
            }
            else {
              ppCVar5 = ppCVar1;
              if (lVar8 <= lVar9) {
                return pCVar6;
              }
            }
          } while (ppCVar10 < ppCVar5);
        }
        pCVar6 = Cluster::Create(this,-1,lVar9);
        if (pCVar6 != (Cluster *)0x0) {
          bVar2 = PreloadCluster(this,pCVar6,(long)ppCVar10 - (long)this->m_clusters >> 3);
          if (bVar2) {
            return pCVar6;
          }
          Cluster::~Cluster(pCVar6);
          operator_delete(pCVar6);
        }
      }
    }
LAB_001576ad:
    pCVar6 = (Cluster *)0x0;
  }
  else if (lVar9 + 1 < this->m_clusterCount) {
    pCVar6 = this->m_clusters[lVar9 + 1];
  }
  else {
    pCVar6 = &this->m_eos;
  }
  return pCVar6;
}

Assistant:

const Cluster* Segment::GetNext(const Cluster* pCurr) {
  assert(pCurr);
  assert(pCurr != &m_eos);
  assert(m_clusters);

  long idx = pCurr->m_index;

  if (idx >= 0) {
    assert(m_clusterCount > 0);
    assert(idx < m_clusterCount);
    assert(pCurr == m_clusters[idx]);

    ++idx;

    if (idx >= m_clusterCount)
      return &m_eos;  // caller will LoadCluster as desired

    Cluster* const pNext = m_clusters[idx];
    assert(pNext);
    assert(pNext->m_index >= 0);
    assert(pNext->m_index == idx);

    return pNext;
  }

  assert(m_clusterPreloadCount > 0);

  long long pos = pCurr->m_element_start;

  assert(m_size >= 0);  // TODO
  const long long stop = m_start + m_size;  // end of segment

  {
    long len;

    long long result = GetUIntLength(m_pReader, pos, len);
    assert(result == 0);
    assert((pos + len) <= stop);  // TODO
    if (result != 0)
      return NULL;

    const long long id = ReadID(m_pReader, pos, len);
    if (id != libwebm::kMkvCluster)
      return NULL;

    pos += len;  // consume ID

    // Read Size
    result = GetUIntLength(m_pReader, pos, len);
    assert(result == 0);  // TODO
    assert((pos + len) <= stop);  // TODO

    const long long size = ReadUInt(m_pReader, pos, len);
    assert(size > 0);  // TODO
    // assert((pCurr->m_size <= 0) || (pCurr->m_size == size));

    pos += len;  // consume length of size of element
    assert((pos + size) <= stop);  // TODO

    // Pos now points to start of payload

    pos += size;  // consume payload
  }

  long long off_next = 0;

  while (pos < stop) {
    long len;

    long long result = GetUIntLength(m_pReader, pos, len);
    assert(result == 0);
    assert((pos + len) <= stop);  // TODO
    if (result != 0)
      return NULL;

    const long long idpos = pos;  // pos of next (potential) cluster

    const long long id = ReadID(m_pReader, idpos, len);
    if (id < 0)
      return NULL;

    pos += len;  // consume ID

    // Read Size
    result = GetUIntLength(m_pReader, pos, len);
    assert(result == 0);  // TODO
    assert((pos + len) <= stop);  // TODO

    const long long size = ReadUInt(m_pReader, pos, len);
    assert(size >= 0);  // TODO

    pos += len;  // consume length of size of element
    assert((pos + size) <= stop);  // TODO

    // Pos now points to start of payload

    if (size == 0)  // weird
      continue;

    if (id == libwebm::kMkvCluster) {
      const long long off_next_ = idpos - m_start;

      long long pos_;
      long len_;

      const long status = Cluster::HasBlockEntries(this, off_next_, pos_, len_);

      assert(status >= 0);

      if (status > 0) {
        off_next = off_next_;
        break;
      }
    }

    pos += size;  // consume payload
  }

  if (off_next <= 0)
    return 0;

  Cluster** const ii = m_clusters + m_clusterCount;
  Cluster** i = ii;

  Cluster** const jj = ii + m_clusterPreloadCount;
  Cluster** j = jj;

  while (i < j) {
    // INVARIANT:
    //[0, i) < pos_next
    //[i, j) ?
    //[j, jj)  > pos_next

    Cluster** const k = i + (j - i) / 2;
    assert(k < jj);

    Cluster* const pNext = *k;
    assert(pNext);
    assert(pNext->m_index < 0);

    // const long long pos_ = pNext->m_pos;
    // assert(pos_);
    // pos = pos_ * ((pos_ < 0) ? -1 : 1);

    pos = pNext->GetPosition();

    if (pos < off_next)
      i = k + 1;
    else if (pos > off_next)
      j = k;
    else
      return pNext;
  }

  assert(i == j);

  Cluster* const pNext = Cluster::Create(this, -1, off_next);
  if (pNext == NULL)
    return NULL;

  const ptrdiff_t idx_next = i - m_clusters;  // insertion position

  if (!PreloadCluster(pNext, idx_next)) {
    delete pNext;
    return NULL;
  }
  assert(m_clusters);
  assert(idx_next < m_clusterSize);
  assert(m_clusters[idx_next] == pNext);

  return pNext;
}